

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O1

int h264_cabac_terminate(bitstream *str,h264_cabac_context *cabac,uint32_t *binVal)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = cabac->codIRange - 2;
  cabac->codIRange = uVar1;
  if (str->dir == VS_ENCODE) {
    if (*binVal == 0) goto LAB_00108efd;
    cabac->codIOffset = cabac->codIOffset + uVar1;
    cabac->codIRange = 2;
    iVar2 = h264_cabac_renorm(str,cabac);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = put_bit(str,cabac,cabac->codIOffset >> 9 & 1);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = put_bit(str,cabac,cabac->codIOffset >> 8 & 1);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = put_bit(str,cabac,1);
  }
  else {
    if (uVar1 <= cabac->codIOffset) {
      *binVal = 1;
      goto LAB_00108f19;
    }
    *binVal = 0;
LAB_00108efd:
    iVar2 = h264_cabac_renorm(str,cabac);
  }
  if (iVar2 != 0) {
    return 1;
  }
LAB_00108f19:
  cabac->BinCount = cabac->BinCount + 1;
  return 0;
}

Assistant:

int h264_cabac_terminate(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t *binVal) {
	cabac->codIRange -= 2;
	if (str->dir == VS_ENCODE) {
		if (*binVal) {
			cabac->codIOffset += cabac->codIRange;
			/* end of the road */
			cabac->codIRange = 2;
			if (h264_cabac_renorm(str, cabac))
				return 1;
			if (put_bit(str, cabac, cabac->codIOffset >> 9 & 1))
				return 1;
			if (put_bit(str, cabac, cabac->codIOffset >> 8 & 1))
				return 1;
			if (put_bit(str, cabac, 1)) /* the last bit, doubling as RBSP terminator if terminating due to end of slice */
				return 1;
		} else {
			if (h264_cabac_renorm(str, cabac))
				return 1;
		}
	} else {
		if (cabac->codIOffset >= cabac->codIRange) {
			*binVal = 1;
		} else {
			*binVal = 0;
			if (h264_cabac_renorm(str, cabac))
				return 1;
		}
	}
	cabac->BinCount++;
	return 0;
}